

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O3

void mxx::allgatherv<int>
               (int *data,size_t size,int *out,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,comm *comm)

{
  pointer puVar1;
  pointer puVar2;
  long lVar3;
  ulong uVar4;
  pointer puVar5;
  uint uVar6;
  datatype mpi_sizet;
  vector<int,_std::allocator<int>_> counts;
  datatype dt;
  vector<int,_std::allocator<int>_> displs;
  
  puVar1 = (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar6 = 0;
  puVar5 = puVar1;
  if (puVar1 != puVar2) {
    do {
      uVar6 = uVar6 + (int)*puVar5;
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar2);
    uVar6 = (uint)(0x7ffffffe < uVar6);
  }
  if ((long)puVar2 - (long)puVar1 >> 3 != (long)comm->m_size) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&mpi_sizet);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",
           (ulong)mpi_sizet._vptr_datatype & 0xffffffff,
           "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/collective.hpp"
           ,0x3e3,"allgatherv","recv_sizes.size() == static_cast<size_t>(comm.size())");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  mpi_sizet._vptr_datatype = (_func_int **)&PTR__datatype_001a5d60;
  mpi_sizet.mpitype = (MPI_Datatype)&ompi_mpi_unsigned_long;
  mpi_sizet.builtin = true;
  if ((char)uVar6 == '\0') {
    dt._vptr_datatype = (_func_int **)&PTR__datatype_001a5d60;
    dt.mpitype = (MPI_Datatype)&ompi_mpi_int;
    dt.builtin = true;
    std::vector<int,_std::allocator<int>_>::vector
              (&counts,(long)comm->m_size,(allocator_type *)&displs);
    puVar1 = (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
             .super__Vector_impl_data._M_start;
    lVar3 = (long)(recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
    if (0 < lVar3) {
      uVar4 = lVar3 + 1;
      lVar3 = 0;
      do {
        *(undefined4 *)
         ((long)counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start + lVar3) = *(undefined4 *)((long)puVar1 + lVar3 * 2);
        uVar4 = uVar4 - 1;
        lVar3 = lVar3 + 4;
      } while (1 < uVar4);
    }
    impl::get_displacements<int>(&displs,&counts);
    MPI_Allgatherv(data,size & 0xffffffff,dt.mpitype,out,
                   counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,dt.mpitype,comm->mpi_comm);
    if (displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    datatype::~datatype(&dt);
  }
  else {
    impl::allgatherv_big<int>(data,size,out,recv_sizes,comm);
  }
  datatype::~datatype(&mpi_sizet);
  return;
}

Assistant:

void allgatherv(const T* data, size_t size, T* out, const std::vector<size_t>& recv_sizes, const mxx::comm& comm = mxx::comm()) {
    size_t total_size = std::accumulate(recv_sizes.begin(), recv_sizes.end(), 0);
    MXX_ASSERT(recv_sizes.size() == static_cast<size_t>(comm.size()));
    mxx::datatype mpi_sizet = mxx::get_datatype<size_t>();
    if (total_size >= mxx::max_int) {
        // use custom implementation for large sizes
        impl::allgatherv_big(data, size, out, recv_sizes, comm);
    } else {
        // use standard MPI_Gatherv
        mxx::datatype dt = mxx::get_datatype<T>();
        std::vector<int> counts(comm.size());
        std::copy(recv_sizes.begin(), recv_sizes.end(), counts.begin());
        std::vector<int> displs = impl::get_displacements(counts);
        MPI_Allgatherv(const_cast<T*>(data), size, dt.type(),
                    out, &counts[0], &displs[0], dt.type(), comm);
    }
}